

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# state.cc
# Opt level: O0

void __thiscall Pool::Dump(Pool *this)

{
  bool bVar1;
  undefined8 uVar2;
  reference ppEVar3;
  _Self local_20;
  _Self local_18;
  const_iterator it;
  Pool *this_local;
  
  it._M_node = (_Base_ptr)this;
  uVar2 = std::__cxx11::string::c_str();
  printf("%s (%d/%d) ->\n",uVar2,(ulong)(uint)this->current_use_,(ulong)(uint)this->depth_);
  local_18._M_node =
       (_Base_ptr)
       std::set<Edge_*,_Pool::WeightedEdgeCmp,_std::allocator<Edge_*>_>::begin(&this->delayed_);
  while( true ) {
    local_20._M_node =
         (_Base_ptr)
         std::set<Edge_*,_Pool::WeightedEdgeCmp,_std::allocator<Edge_*>_>::end(&this->delayed_);
    bVar1 = std::operator!=(&local_18,&local_20);
    if (!bVar1) break;
    printf("\t");
    ppEVar3 = std::_Rb_tree_const_iterator<Edge_*>::operator*(&local_18);
    Edge::Dump(*ppEVar3,"");
    std::_Rb_tree_const_iterator<Edge_*>::operator++(&local_18);
  }
  return;
}

Assistant:

void Pool::Dump() const {
  printf("%s (%d/%d) ->\n", name_.c_str(), current_use_, depth_);
  for (DelayedEdges::const_iterator it = delayed_.begin();
       it != delayed_.end(); ++it)
  {
    printf("\t");
    (*it)->Dump();
  }
}